

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textureProps.cpp
# Opt level: O3

GLenum vera::getMagnificationFilter(TextureFilter _filter)

{
  return getFilter::filters[_filter];
}

Assistant:

GLenum getFilter( TextureFilter _filter ) {
    static GLenum filters[6] = {
        GL_LINEAR, GL_NEAREST 
        // GL_NEAREST_MIPMAP_NEAREST, 
        // GL_LINEAR_MIPMAP_NEAREST, 
        // GL_NEAREST_MIPMAP_LINEAR, 
        // GL_LINEAR_MIPMAP_LINEAR 
    };
    return filters[_filter];
}